

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local.h
# Opt level: O2

TVMFuncThreadLocalEntry * dmlc::ThreadLocalStore<TVMFuncThreadLocalEntry>::Get(void)

{
  long *in_FS_OFFSET;
  
  if ((char)in_FS_OFFSET[-0xc] == '\0') {
    in_FS_OFFSET[-0xe] = 0;
    in_FS_OFFSET[-0xd] = 0;
    in_FS_OFFSET[-0x10] = 0;
    in_FS_OFFSET[-0xf] = 0;
    in_FS_OFFSET[-0x12] = 0;
    in_FS_OFFSET[-0x11] = 0;
    __cxa_thread_atexit(TVMFuncThreadLocalEntry::~TVMFuncThreadLocalEntry,*in_FS_OFFSET + -0x90,
                        &__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0xc) = 1;
  }
  return (TVMFuncThreadLocalEntry *)(*in_FS_OFFSET + -0x90);
}

Assistant:

static T *Get() {
#if DMLC_CXX11_THREAD_LOCAL
    static thread_local T inst;
    return &inst;
#else
    static MX_THREAD_LOCAL T *ptr = nullptr;
    if (ptr == nullptr) {
      ptr = new T();
      Singleton()->RegisterDelete(ptr);
    }
    return ptr;
#endif
  }